

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arduino-rx-web.cpp
# Opt level: O1

bool GGWave_deinit(void)

{
  bool bVar1;
  bool bVar2;
  GGWave *pGVar3;
  
  pGVar3 = (anonymous_namespace)::g_ggWave;
  bVar1 = (anonymous_namespace)::g_devIdOut != 0;
  bVar2 = (anonymous_namespace)::g_devIdInp != 0;
  if (bVar1 || bVar2) {
    if ((anonymous_namespace)::g_ggWave != (GGWave *)0x0) {
      GGWave::~GGWave((anonymous_namespace)::g_ggWave);
      operator_delete(pGVar3);
    }
    (anonymous_namespace)::g_ggWave = (GGWave *)0x0;
    SDL_PauseAudioDevice((anonymous_namespace)::g_devIdInp,1);
    SDL_CloseAudioDevice((anonymous_namespace)::g_devIdInp);
    SDL_PauseAudioDevice((anonymous_namespace)::g_devIdOut,1);
    SDL_CloseAudioDevice((anonymous_namespace)::g_devIdOut);
    (anonymous_namespace)::g_devIdInp = 0;
    (anonymous_namespace)::g_devIdOut = 0;
  }
  return bVar1 || bVar2;
}

Assistant:

bool GGWave_deinit() {
    if (g_devIdInp == 0 && g_devIdOut == 0) {
        return false;
    }

    delete g_ggWave;
    g_ggWave = nullptr;

    SDL_PauseAudioDevice(g_devIdInp, 1);
    SDL_CloseAudioDevice(g_devIdInp);
    SDL_PauseAudioDevice(g_devIdOut, 1);
    SDL_CloseAudioDevice(g_devIdOut);

    g_devIdInp = 0;
    g_devIdOut = 0;

    return true;
}